

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O0

void __thiscall deci::array_t::Append(array_t *this,value_t *el)

{
  int iVar1;
  undefined4 extraout_var;
  value_type local_20;
  value_t *local_18;
  value_t *el_local;
  array_t *this_local;
  
  local_18 = el;
  el_local = &this->super_value_t;
  iVar1 = (*el->_vptr_value_t[2])();
  local_20 = (value_type)CONCAT44(extraout_var,iVar1);
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::push_back
            (&this->elements,&local_20);
  return;
}

Assistant:

void array_t::Append(const value_t& el) {
      this->elements.push_back(el.Copy());
    }